

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Transmitter_PDU::SetAntennaPattern(Transmitter_PDU *this,KOCTET *AP,KUINT16 Length)

{
  KUINT16 *pKVar1;
  pointer pcVar2;
  pointer pcVar3;
  byte bVar4;
  KUINT16 KVar5;
  KUINT8 i;
  byte bVar6;
  bool bVar7;
  char local_29;
  
  bVar4 = (byte)Length;
  pcVar2 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + ((short)pcVar2 - (short)pcVar3);
  if (pcVar2 != pcVar3) {
    (this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar2;
  }
  while (bVar7 = Length != 0, Length = Length - 1, bVar7) {
    std::vector<char,_std::allocator<char>_>::push_back(&this->m_vAntennaPattern,AP);
    AP = AP + 1;
  }
  for (bVar6 = 0; bVar6 < (bVar4 & 7); bVar6 = bVar6 + 1) {
    local_29 = '\0';
    std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->m_vAntennaPattern,&local_29)
    ;
  }
  KVar5 = (short)*(undefined4 *)
                  &(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl
                   .super__Vector_impl_data._M_finish -
          (short)*(undefined4 *)
                  &(this->m_vAntennaPattern).super__Vector_base<char,_std::allocator<char>_>._M_impl
                   .super__Vector_impl_data._M_start;
  this->m_ui16AntennaPatternLength = KVar5;
  pKVar1 = &(this->super_Radio_Communications_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + KVar5;
  return;
}

Assistant:

void Transmitter_PDU::SetAntennaPattern( const KOCTET * AP, KUINT16 Length )
{
    // If we already have data clear it first.
    m_ui16PDULength -= m_vAntennaPattern.size();
    m_vAntennaPattern.clear();

    // Copy data into the vector
    for( KUINT16 i = 0; i < Length; ++i, ++AP )
    {
        m_vAntennaPattern.push_back( *AP );
    }

    // Check if we need to add any padding, the length should be a
    // multiple of 8.
    KUINT8 ui8PaddingNeeded = Length % 8;

    // Add the padding, if needed.
    for( KUINT8 i = 0; i < ui8PaddingNeeded; ++ i )
    {
        m_vAntennaPattern.push_back( 0 );
    }

    // Update length
    m_ui16AntennaPatternLength = m_vAntennaPattern.size();
    m_ui16PDULength += m_ui16AntennaPatternLength;
}